

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O3

xmlAttrPtr xmlCopyPropList(xmlNodePtr target,xmlAttrPtr cur)

{
  _xmlAttr *p_Var1;
  xmlAttrPtr pxVar2;
  xmlAttrPtr pxVar3;
  _xmlAttr *cur_00;
  xmlAttrPtr pxVar4;
  
  if (target == (xmlNodePtr)0x0) {
    if (cur == (xmlAttrPtr)0x0) {
      return (xmlAttrPtr)0x0;
    }
  }
  else if (cur == (xmlAttrPtr)0x0 || target->type != XML_ELEMENT_NODE) {
    return (xmlAttrPtr)0x0;
  }
  cur_00 = (xmlAttrPtr)0x0;
  pxVar4 = (xmlAttrPtr)0x0;
  do {
    pxVar3 = xmlCopyPropInternal((xmlDocPtr)0x0,target,cur);
    if (pxVar3 == (xmlAttrPtr)0x0) {
      if (cur_00 == (xmlAttrPtr)0x0) {
        return (xmlAttrPtr)0x0;
      }
      do {
        p_Var1 = cur_00->next;
        xmlFreeProp(cur_00);
        cur_00 = p_Var1;
      } while (p_Var1 != (_xmlAttr *)0x0);
      return (xmlAttrPtr)0x0;
    }
    pxVar2 = pxVar3;
    if (pxVar4 != (xmlAttrPtr)0x0) {
      pxVar4->next = pxVar3;
      pxVar3->prev = pxVar4;
      pxVar2 = cur_00;
    }
    cur_00 = pxVar2;
    cur = cur->next;
    pxVar4 = pxVar3;
  } while (cur != (_xmlAttr *)0x0);
  return cur_00;
}

Assistant:

xmlAttrPtr
xmlCopyPropList(xmlNodePtr target, xmlAttrPtr cur) {
    xmlAttrPtr ret = NULL;
    xmlAttrPtr p = NULL,q;

    if ((target != NULL) && (target->type != XML_ELEMENT_NODE))
        return(NULL);
    while (cur != NULL) {
        q = xmlCopyProp(target, cur);
	if (q == NULL) {
            xmlFreePropList(ret);
	    return(NULL);
        }
	if (p == NULL) {
	    ret = p = q;
	} else {
	    p->next = q;
	    q->prev = p;
	    p = q;
	}
	cur = cur->next;
    }
    return(ret);
}